

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

int secp256k1_fe_is_square_var(secp256k1_fe *x)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  secp256k1_fe *b;
  secp256k1_fe *psVar7;
  secp256k1_fe *psVar8;
  uint64_t *t;
  long lVar9;
  int iVar10;
  secp256k1_fe *in_RSI;
  secp256k1_fe *psVar11;
  ulong uVar12;
  secp256k1_fe *psVar13;
  uint64_t *puVar14;
  uint64_t *puVar15;
  secp256k1_fe *psVar16;
  secp256k1_fe *psVar17;
  int iVar18;
  secp256k1_fe *psVar19;
  secp256k1_fe *unaff_R14;
  secp256k1_fe *psVar20;
  uint uVar21;
  uint64_t uVar22;
  long lVar23;
  secp256k1_fe sqrt;
  secp256k1_fe tmp;
  secp256k1_modinv64_signed62 s;
  secp256k1_fe sStack_1d0;
  secp256k1_fe *psStack_1a0;
  secp256k1_fe *psStack_198;
  secp256k1_fe sStack_190;
  secp256k1_fe sStack_160;
  secp256k1_fe *psStack_130;
  ulong uStack_128;
  secp256k1_fe *psStack_120;
  secp256k1_modinv64_trans2x2 sStack_118;
  secp256k1_fe *psStack_f8;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  secp256k1_modinv64_signed62 local_68;
  secp256k1_fe local_40;
  ulong uVar24;
  
  psVar7 = &local_c8;
  psVar13 = &local_c8;
  b = &local_c8;
  local_98.n[0] = x->n[0];
  local_98.n[1] = x->n[1];
  local_98.n[2] = x->n[2];
  local_98.n[3] = x->n[3];
  local_98.n[4] = x->n[4];
  local_98.magnitude = x->magnitude;
  local_98.normalized = x->normalized;
  secp256k1_fe_verify(x);
  local_c8.n[0] = x->n[0];
  local_c8.n[1] = x->n[1];
  local_c8.n[2] = x->n[2];
  local_c8.n[3] = x->n[3];
  local_c8.n[4] = x->n[4];
  local_c8.magnitude = x->magnitude;
  local_c8.normalized = x->normalized;
  secp256k1_fe_normalize_var(&local_c8);
  secp256k1_fe_verify(&local_c8);
  if (local_c8.normalized == 0) {
    secp256k1_fe_is_square_var_cold_2();
  }
  else {
    if (((local_c8.n[2] == 0 && local_c8.n[3] == 0) && (local_c8.n[1] == 0 && local_c8.n[0] == 0))
        && local_c8.n[4] == 0) {
      b = (secp256k1_fe *)0x1;
    }
    else {
      local_68.v[0] = (local_c8.n[1] << 0x34 | local_c8.n[0]) & 0x3fffffffffffffff;
      local_68.v[1] = (ulong)((uint)local_c8.n[2] & 0xfffff) << 0x2a | local_c8.n[1] >> 10;
      local_68.v[2] = (ulong)((uint)local_c8.n[3] & 0x3fffffff) << 0x20 | local_c8.n[2] >> 0x14;
      local_68.v[3] = (local_c8.n[4] & 0xffffffffff) << 0x16 | local_c8.n[3] >> 0x1e;
      local_68.v[4] = local_c8.n[4] >> 0x28;
      uVar1 = secp256k1_jacobi64_maybe_var(&local_68,&secp256k1_const_modinfo_fe);
      if (uVar1 == 0) {
        uVar1 = secp256k1_fe_sqrt(&local_40,&local_c8);
        b = (secp256k1_fe *)(ulong)uVar1;
      }
      else {
        b = (secp256k1_fe *)(ulong)(~uVar1 >> 0x1f);
      }
    }
    unaff_R14 = &local_98;
    secp256k1_fe_verify(unaff_R14);
    local_98.n[0] = (local_98.n[4] >> 0x30) * 0x1000003d1 + local_98.n[0];
    local_98.n[1] = (local_98.n[0] >> 0x34) + local_98.n[1];
    local_98.n[2] = (local_98.n[1] >> 0x34) + local_98.n[2];
    uVar12 = (local_98.n[2] >> 0x34) + local_98.n[3];
    local_98.n[3] = uVar12 & 0xfffffffffffff;
    local_98.n[4] = (uVar12 >> 0x34) + (local_98.n[4] & 0xffffffffffff);
    local_98.n[2] = local_98.n[2] & 0xfffffffffffff;
    local_98.n[1] = local_98.n[1] & 0xfffffffffffff;
    local_98.n[0] = local_98.n[0] & 0xfffffffffffff;
    local_98.magnitude = 1;
    secp256k1_fe_verify(unaff_R14);
    in_RSI = unaff_R14;
    iVar2 = secp256k1_fe_sqrt(&local_c8,unaff_R14);
    psVar7 = psVar13;
    if ((int)b == iVar2) {
      return (int)b;
    }
  }
  secp256k1_fe_is_square_var_cold_1();
  psStack_f8 = b;
  sStack_160.n[4] = in_RSI->n[4];
  uVar22 = in_RSI->n[0];
  sStack_160.n[2] = in_RSI->n[2];
  sStack_160.n[3] = in_RSI->n[3];
  sStack_160.n[0] = uVar22;
  sStack_160.n[1] = in_RSI->n[1];
  sStack_190.n[0] = psVar7->n[0];
  sStack_190.n[1] = psVar7->n[1];
  sStack_190.n[2] = psVar7->n[2];
  sStack_190.n[3] = psVar7->n[3];
  sStack_190.n[4] = psVar7->n[4];
  if (((((long)sStack_190.n[0] < 0) || ((long)sStack_190.n[1] < 0)) ||
      (b = in_RSI, (long)sStack_190.n[2] < 0)) ||
     ((psVar7 = (secp256k1_fe *)sStack_190.n[3], (long)sStack_190.n[3] < 0 ||
      ((long)sStack_190.n[4] < 0)))) {
LAB_00151c1d:
    psStack_198 = (secp256k1_fe *)0x151c22;
    secp256k1_jacobi64_maybe_var_cold_18();
  }
  else if (((sStack_190.n[2] != 0 || (secp256k1_fe *)sStack_190.n[3] != (secp256k1_fe *)0x0) ||
           (sStack_190.n[1] != 0 || sStack_190.n[0] != 0)) || sStack_190.n[4] != 0) {
    unaff_R14 = (secp256k1_fe *)0x5;
    lVar9 = -1;
    uStack_128 = 0;
    psVar7 = (secp256k1_fe *)0x0;
    psStack_130 = in_RSI;
    do {
      b = psStack_130;
      psVar13 = (secp256k1_fe *)(sStack_160.n[1] << 0x3e | uVar22);
      puVar14 = (uint64_t *)(sStack_190.n[1] << 0x3e | sStack_190.n[0]);
      lVar3 = 0;
      psVar17 = (secp256k1_fe *)0x0;
      lVar23 = 1;
      iVar2 = 0x3e;
      psVar20 = (secp256k1_fe *)0x1;
      puVar15 = puVar14;
      psVar19 = psVar13;
      while( true ) {
        uVar12 = -1L << ((byte)iVar2 & 0x3f) | (ulong)puVar15;
        lVar4 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        bVar5 = (byte)lVar4;
        psVar16 = (secp256k1_fe *)((ulong)puVar15 >> (bVar5 & 0x3f));
        psVar20 = (secp256k1_fe *)((long)psVar20 << (bVar5 & 0x3f));
        lVar3 = lVar3 << (bVar5 & 0x3f);
        lVar9 = lVar9 - lVar4;
        uVar1 = ((uint)((ulong)psVar19 >> 1) ^ (uint)((ulong)psVar19 >> 2)) & (uint)lVar4 ^
                (uint)psVar7;
        iVar2 = iVar2 - (uint)lVar4;
        psStack_120 = unaff_R14;
        if (iVar2 == 0) break;
        if (((ulong)psVar19 & 1) == 0) {
          psStack_198 = (secp256k1_fe *)0x151bd2;
          secp256k1_jacobi64_maybe_var_cold_7();
LAB_00151bd2:
          psStack_198 = (secp256k1_fe *)0x151bd7;
          secp256k1_jacobi64_maybe_var_cold_6();
LAB_00151bd7:
          psStack_198 = (secp256k1_fe *)0x151bdc;
          secp256k1_jacobi64_maybe_var_cold_1();
LAB_00151bdc:
          psStack_198 = (secp256k1_fe *)0x151be1;
          secp256k1_jacobi64_maybe_var_cold_2();
          goto LAB_00151be1;
        }
        if (((ulong)psVar16 & 1) == 0) goto LAB_00151bd2;
        bVar5 = 0x3e - (char)iVar2;
        psVar7 = (secp256k1_fe *)((long)psVar19 << (bVar5 & 0x3f));
        if ((secp256k1_fe *)(lVar3 * (long)puVar14 + (long)psVar20 * (long)psVar13) != psVar7)
        goto LAB_00151bd7;
        psVar7 = (secp256k1_fe *)(lVar23 * (long)puVar14 + (long)psVar17 * (long)psVar13);
        if (psVar7 != (secp256k1_fe *)((long)psVar16 << (bVar5 & 0x3f))) goto LAB_00151bdc;
        iVar18 = (int)psVar19;
        iVar10 = (int)psVar16;
        if (lVar9 < 0) {
          lVar9 = -lVar9;
          iVar6 = (int)lVar9 + 1;
          if (iVar2 <= iVar6) {
            iVar6 = iVar2;
          }
          if (0xffffffc1 < iVar6 - 0x3fU) {
            psVar7 = (secp256k1_fe *)(ulong)(uVar1 ^ (uint)(((ulong)psVar16 & (ulong)psVar19) >> 1))
            ;
            uVar12 = (ulong)(0x3fL << (-(char)iVar6 & 0x3fU)) >> (-(char)iVar6 & 0x3fU);
            uVar21 = (iVar10 * iVar10 + 0x3e) * iVar10 * iVar18 & (uint)uVar12;
            lVar4 = lVar3;
            lVar3 = lVar23;
            psVar8 = psVar16;
            psVar11 = psVar20;
            psVar20 = psVar17;
            goto LAB_001519ca;
          }
          goto LAB_00151beb;
        }
        iVar6 = (int)lVar9 + 1;
        if (iVar2 <= iVar6) {
          iVar6 = iVar2;
        }
        if (iVar6 - 0x3fU < 0xffffffc2) goto LAB_00151be6;
        uVar12 = (ulong)(0xfL << (-(char)iVar6 & 0x3fU)) >> (-(char)iVar6 & 0x3fU);
        uVar21 = -(iVar10 * ((iVar18 * 2 + 2U & 8) + iVar18)) & (uint)uVar12;
        lVar4 = lVar23;
        psVar8 = psVar19;
        psVar11 = psVar17;
        psVar19 = psVar16;
        psVar7 = (secp256k1_fe *)(ulong)uVar1;
LAB_001519ca:
        uVar24 = (ulong)uVar21;
        puVar15 = (uint64_t *)((long)psVar19->n + uVar24 * (long)psVar8);
        psVar17 = (secp256k1_fe *)((long)psVar11->n + (long)psVar20 * uVar24);
        lVar23 = uVar24 * lVar3 + lVar4;
        psVar19 = psVar8;
        if (((ulong)puVar15 & uVar12) != 0) {
LAB_00151be1:
          psStack_198 = (secp256k1_fe *)0x151be6;
          secp256k1_jacobi64_maybe_var_cold_4();
LAB_00151be6:
          psStack_198 = (secp256k1_fe *)0x151beb;
          secp256k1_jacobi64_maybe_var_cold_3();
LAB_00151beb:
          psStack_198 = (secp256k1_fe *)0x151bf0;
          secp256k1_jacobi64_maybe_var_cold_5();
          goto LAB_00151bf0;
        }
      }
      psVar13 = (secp256k1_fe *)(lVar3 * (long)psVar17);
      lVar4 = (long)psVar20 * lVar23 - (long)psVar13;
      uVar12 = (ulong)((secp256k1_fe *)((long)psVar20 * lVar23) < psVar13);
      uVar24 = SUB168(SEXT816((long)psVar20) * SEXT816(lVar23),8) -
               SUB168(SEXT816(lVar3) * SEXT816((long)psVar17),8);
      sStack_118.u = (int64_t)psVar20;
      sStack_118.v = lVar3;
      sStack_118.q = (int64_t)psVar17;
      sStack_118.r = lVar23;
      if ((lVar4 != 0x4000000000000000 || uVar24 != uVar12) &&
         (uVar24 - uVar12 != -1 || lVar4 != -0x4000000000000000)) {
LAB_00151bf0:
        psStack_198 = (secp256k1_fe *)0x151bf5;
        secp256k1_jacobi64_maybe_var_cold_16();
        b = psVar7;
        unaff_R14 = psVar20;
LAB_00151bf5:
        psStack_198 = (secp256k1_fe *)0x151bfa;
        secp256k1_jacobi64_maybe_var_cold_15();
LAB_00151bfa:
        psStack_198 = (secp256k1_fe *)0x151bff;
        secp256k1_jacobi64_maybe_var_cold_14();
LAB_00151bff:
        psStack_198 = (secp256k1_fe *)0x151c04;
        secp256k1_jacobi64_maybe_var_cold_13();
LAB_00151c04:
        psStack_198 = (secp256k1_fe *)0x151c09;
        secp256k1_jacobi64_maybe_var_cold_12();
LAB_00151c09:
        psVar7 = psVar13;
        psStack_198 = (secp256k1_fe *)0x151c0e;
        secp256k1_jacobi64_maybe_var_cold_11();
LAB_00151c0e:
        psStack_198 = (secp256k1_fe *)0x151c13;
        secp256k1_jacobi64_maybe_var_cold_10();
LAB_00151c13:
        psStack_198 = (secp256k1_fe *)0x151c18;
        secp256k1_jacobi64_maybe_var_cold_9();
LAB_00151c18:
        psStack_198 = (secp256k1_fe *)0x151c1d;
        secp256k1_jacobi64_maybe_var_cold_8();
        goto LAB_00151c1d;
      }
      iVar10 = (int)unaff_R14;
      psStack_198 = (secp256k1_fe *)0x151a73;
      psVar13 = &sStack_160;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_160,iVar10,
                         (secp256k1_modinv64_signed62 *)psStack_130,0);
      if (iVar2 < 1) goto LAB_00151bf5;
      psStack_198 = (secp256k1_fe *)0x151a8e;
      psVar13 = &sStack_160;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_160,iVar10,
                         (secp256k1_modinv64_signed62 *)b,1);
      if (0 < iVar2) goto LAB_00151bfa;
      psStack_198 = (secp256k1_fe *)0x151aa6;
      psVar13 = &sStack_190;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_190,iVar10,
                         (secp256k1_modinv64_signed62 *)b,0);
      if (iVar2 < 1) goto LAB_00151bff;
      psStack_198 = (secp256k1_fe *)0x151ac1;
      psVar13 = &sStack_190;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_190,iVar10,
                         (secp256k1_modinv64_signed62 *)b,1);
      if (-1 < iVar2) goto LAB_00151c04;
      psStack_198 = (secp256k1_fe *)0x151adc;
      secp256k1_modinv64_update_fg_62_var
                (iVar10,(secp256k1_modinv64_signed62 *)&sStack_160,
                 (secp256k1_modinv64_signed62 *)&sStack_190,&sStack_118);
      uVar22 = sStack_160.n[0];
      if (sStack_160.n[0] == 1) {
        if (iVar10 < 2) {
LAB_00151bac:
          return 1 - (uVar1 * 2 & 2);
        }
        psVar7 = (secp256k1_fe *)0x1;
        uVar12 = 0;
        do {
          uVar12 = uVar12 | sStack_160.n[(long)psVar7];
          psVar7 = (secp256k1_fe *)((long)psVar7->n + 1);
        } while (unaff_R14 != psVar7);
        if (uVar12 == 0) goto LAB_00151bac;
      }
      lVar3 = (long)iVar10;
      if ((-1 < lVar3 + -2 && sStack_190.n[lVar3 + 5] == 0) &&
          (&psStack_198)[lVar3] == (secp256k1_fe *)0x0) {
        unaff_R14 = (secp256k1_fe *)(ulong)(iVar10 - 1);
      }
      psVar7 = &sStack_160;
      psStack_198 = (secp256k1_fe *)0x151b43;
      iVar10 = (int)unaff_R14;
      psVar13 = psVar7;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar7,iVar10,
                         (secp256k1_modinv64_signed62 *)b,0);
      if (iVar2 < 1) goto LAB_00151c09;
      psStack_198 = (secp256k1_fe *)0x151b5e;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar7,iVar10,
                         (secp256k1_modinv64_signed62 *)b,1);
      if (0 < iVar2) goto LAB_00151c0e;
      psStack_198 = (secp256k1_fe *)0x151b79;
      psVar7 = &sStack_190;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_190,iVar10,
                         (secp256k1_modinv64_signed62 *)b,0);
      if (iVar2 < 1) goto LAB_00151c13;
      psStack_198 = (secp256k1_fe *)0x151b94;
      psVar7 = &sStack_190;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_190,iVar10,
                         (secp256k1_modinv64_signed62 *)b,1);
      if (-1 < iVar2) goto LAB_00151c18;
      uVar21 = (int)uStack_128 + 1;
      uStack_128 = (ulong)uVar21;
      psVar7 = (secp256k1_fe *)(ulong)uVar1;
      if (uVar21 == 0xc) {
        return 0;
      }
    } while( true );
  }
  psStack_198 = (secp256k1_fe *)secp256k1_ge_x_on_curve_var;
  secp256k1_jacobi64_maybe_var_cold_17();
  psStack_1a0 = b;
  psStack_198 = unaff_R14;
  secp256k1_fe_sqr(&sStack_1d0,psVar7);
  secp256k1_fe_mul(&sStack_1d0,&sStack_1d0,psVar7);
  secp256k1_fe_verify(&sStack_1d0);
  sStack_1d0.n[0] = sStack_1d0.n[0] + 7;
  sStack_1d0.magnitude = sStack_1d0.magnitude + 1;
  sStack_1d0.normalized = 0;
  secp256k1_fe_verify(&sStack_1d0);
  iVar2 = secp256k1_fe_is_square_var(&sStack_1d0);
  return iVar2;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_is_square_var(const secp256k1_fe *x) {
    int ret;
    secp256k1_fe tmp = *x, sqrt;
    SECP256K1_FE_VERIFY(x);

    ret = secp256k1_fe_impl_is_square_var(x);
    secp256k1_fe_normalize_weak(&tmp);
    VERIFY_CHECK(ret == secp256k1_fe_sqrt(&sqrt, &tmp));
    return ret;
}